

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

int main(void)

{
  int iVar1;
  ulong uVar2;
  uint seed;
  
  plan(1);
  uVar2 = time((time_t *)0x0);
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"random seed is %u",uVar2 & 0xffffffff);
  fprintf(_stdout,"\n");
  srand((uint)uVar2);
  test_align_down();
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

int
main(void)
{
#ifdef ENABLE_ASAN
	plan(3);
#else
	plan(1);
#endif

	unsigned int seed = time(NULL);
	note("random seed is %u", seed);
	srand(seed);

#ifdef ENABLE_ASAN
	test_asan_poison_assumptions();
	test_asan_alloc();
#endif
	test_align_down();

	return check_plan();
}